

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void LzmaEnc_InitPrices(CLzmaEnc *p)

{
  int iVar1;
  long in_RDI;
  UInt32 in_stack_0000000c;
  CLenPriceEnc *in_stack_00000010;
  CLzmaEnc *in_stack_00000230;
  
  if (*(int *)(in_RDI + 0x80) == 0) {
    FillDistancesPrices(in_stack_00000230);
    FillAlignPrices(p);
  }
  iVar1 = *(int *)(in_RDI + 0x44) + -1;
  *(int *)(in_RDI + 0x38f04) = iVar1;
  *(int *)(in_RDI + 0x346bc) = iVar1;
  LenPriceEnc_UpdateTables(in_stack_00000010,in_stack_0000000c,(UInt32 *)p);
  LenPriceEnc_UpdateTables(in_stack_00000010,in_stack_0000000c,(UInt32 *)p);
  return;
}

Assistant:

void LzmaEnc_InitPrices(CLzmaEnc *p)
{
  if (!p->fastMode)
  {
    FillDistancesPrices(p);
    FillAlignPrices(p);
  }

  p->lenEnc.tableSize =
  p->repLenEnc.tableSize =
      p->numFastBytes + 1 - LZMA_MATCH_LEN_MIN;
  LenPriceEnc_UpdateTables(&p->lenEnc, 1 << p->pb, p->ProbPrices);
  LenPriceEnc_UpdateTables(&p->repLenEnc, 1 << p->pb, p->ProbPrices);
}